

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

xmlNodePtr xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  xmlElementType xVar1;
  int iVar2;
  
  do {
    if (node == (xmlNodePtr)0x0) {
      return (xmlNodePtr)0x0;
    }
    xVar1 = node->type;
    if (XML_XINCLUDE_END < xVar1) {
      return node;
    }
    if ((0x180180U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if ((0x18U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        return node;
      }
      if (((ctxt->flags & 4) == 0) && (iVar2 = xmlRelaxNGIsBlank(node->content), iVar2 == 0)) {
        return node;
      }
    }
    node = node->next;
  } while( true );
}

Assistant:

static xmlNodePtr
xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt ATTRIBUTE_UNUSED,
                      xmlNodePtr node)
{
    /*
     * TODO complete and handle entities
     */
    while ((node != NULL) &&
           ((node->type == XML_COMMENT_NODE) ||
            (node->type == XML_PI_NODE) ||
	    (node->type == XML_XINCLUDE_START) ||
	    (node->type == XML_XINCLUDE_END) ||
            (((node->type == XML_TEXT_NODE) ||
              (node->type == XML_CDATA_SECTION_NODE)) &&
             ((ctxt->flags & FLAGS_MIXED_CONTENT) ||
              (IS_BLANK_NODE(node)))))) {
        node = node->next;
    }
    return (node);
}